

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloexec.c
# Opt level: O2

void cloexec(int fd)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  char *__format;
  FILE *__stream;
  
  uVar1 = fcntl(fd,1);
  __stream = _stderr;
  if ((int)uVar1 < 0) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    __format = "%d: fcntl(F_GETFD): %s\n";
  }
  else {
    iVar2 = fcntl(fd,2,(ulong)(uVar1 | 1));
    __stream = _stderr;
    if (-1 < iVar2) {
      return;
    }
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    __format = "%d: fcntl(F_SETFD): %s\n";
  }
  fprintf(__stream,__format,fd,pcVar4);
  exit(1);
}

Assistant:

void cloexec(int fd)
{
    int fdflags;

    fdflags = fcntl(fd, F_GETFD);
    if (fdflags < 0) {
        fprintf(stderr, "%d: fcntl(F_GETFD): %s\n", fd, strerror(errno));
        exit(1);
    }
    if (fcntl(fd, F_SETFD, fdflags | FD_CLOEXEC) < 0) {
        fprintf(stderr, "%d: fcntl(F_SETFD): %s\n", fd, strerror(errno));
        exit(1);
    }
}